

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::SetNextPlotTicksX
               (double x_min,double x_max,int n_ticks,char **labels,bool show_default)

{
  int iVar1;
  double *values;
  bool show_default_local;
  char **labels_local;
  int n_ticks_local;
  double x_max_local;
  double x_min_local;
  
  if (n_ticks < 2) {
    __assert_fail("(n_ticks > 1) && \"The number of ticks must be greater than 1\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xa2f,
                  "void ImPlot::SetNextPlotTicksX(double, double, int, const char *const *, bool)");
  }
  if ((SetNextPlotTicksX(double,double,int,char_const**,bool)::buffer == '\0') &&
     (iVar1 = __cxa_guard_acquire(&SetNextPlotTicksX(double,double,int,char_const**,bool)::buffer),
     iVar1 != 0)) {
    ImVector<double>::ImVector(&SetNextPlotTicksX::buffer);
    __cxa_atexit(ImVector<double>::~ImVector,&SetNextPlotTicksX::buffer,&__dso_handle);
    __cxa_guard_release(&SetNextPlotTicksX(double,double,int,char_const**,bool)::buffer);
  }
  FillRange<double>(&SetNextPlotTicksX::buffer,n_ticks,x_min,x_max);
  values = ImVector<double>::operator[](&SetNextPlotTicksX::buffer,0);
  SetNextPlotTicksX(values,n_ticks,labels,show_default);
  return;
}

Assistant:

void SetNextPlotTicksX(double x_min, double x_max, int n_ticks, const char* const labels[], bool show_default) {
    IM_ASSERT_USER_ERROR(n_ticks > 1, "The number of ticks must be greater than 1");
    static ImVector<double> buffer;
    FillRange(buffer, n_ticks, x_min, x_max);
    SetNextPlotTicksX(&buffer[0], n_ticks, labels, show_default);
}